

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::release
          (list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
           *this)

{
  undefined8 uVar1;
  long in_RDI;
  node *n;
  
  while (*(long *)(in_RDI + 8) != 0) {
    uVar1 = **(undefined8 **)(in_RDI + 8);
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 8),0x2808);
    }
    *(undefined8 *)(in_RDI + 8) = uVar1;
  }
  return;
}

Assistant:

void release() {
    // Suppose node was contained by an std::unique_ptr, then it may happen
    // that we hit a recursion limit depending on how many nodes are destructed.
    while (head_ != nullptr) {
      node* n = head_->prev;
      delete head_;
      head_ = n;
    }
  }